

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<VcprojGenerator*>::emplace<VcprojGenerator*&>
          (QPodArrayOps<VcprojGenerator_*> *this,qsizetype i,VcprojGenerator **args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  VcprojGenerator **ppVVar3;
  undefined8 *in_RDX;
  long in_RSI;
  QArrayDataPointer<VcprojGenerator_*> *in_RDI;
  VcprojGenerator **where;
  GrowthPosition pos;
  VcprojGenerator *tmp;
  bool detach;
  QArrayDataPointer<VcprojGenerator_*> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  VcprojGenerator *pVVar5;
  undefined7 in_stack_ffffffffffffffe0;
  
  uVar1 = QArrayDataPointer<VcprojGenerator_*>::needsDetach(in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->size) &&
       (qVar2 = QArrayDataPointer<VcprojGenerator_*>::freeSpaceAtEnd(in_stack_ffffffffffffffc8),
       qVar2 != 0)) {
      ppVVar3 = QArrayDataPointer<VcprojGenerator_*>::end(in_RDI);
      *ppVVar3 = (VcprojGenerator *)*in_RDX;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<VcprojGenerator_*>::freeSpaceAtBegin(in_stack_ffffffffffffffc8),
       qVar2 != 0)) {
      ppVVar3 = QArrayDataPointer<VcprojGenerator_*>::begin
                          ((QArrayDataPointer<VcprojGenerator_*> *)0x2a6c07);
      ppVVar3[-1] = (VcprojGenerator *)*in_RDX;
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
  }
  pVVar5 = (VcprojGenerator *)*in_RDX;
  uVar4 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<VcprojGenerator_*>::detachAndGrow
            ((QArrayDataPointer<VcprojGenerator_*> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),
             (GrowthPosition)((ulong)pVVar5 >> 0x20),CONCAT44(uVar4,in_stack_ffffffffffffffd0),
             (VcprojGenerator ***)in_stack_ffffffffffffffc8,in_RDI);
  ppVVar3 = QPodArrayOps<VcprojGenerator_*>::createHole
                      ((QPodArrayOps<VcprojGenerator_*> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),
                       (GrowthPosition)((ulong)pVVar5 >> 0x20),
                       CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                       (qsizetype)in_stack_ffffffffffffffc8);
  *ppVVar3 = pVVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }